

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

void spell_cure_light(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  int iVar1;
  
  iVar1 = dice(1,8);
  iVar1 = level / 3 + iVar1 + *(int *)((long)vo + 0x158);
  if (*(short *)((long)vo + 0x15c) <= iVar1) {
    iVar1 = (int)*(short *)((long)vo + 0x15c);
  }
  *(int *)((long)vo + 0x158) = iVar1;
  update_pos((CHAR_DATA *)vo);
  send_to_char("You feel better!\n\r",(CHAR_DATA *)vo);
  if (ch != (CHAR_DATA *)vo) {
    send_to_char("Ok.\n\r",ch);
    return;
  }
  return;
}

Assistant:

void spell_cure_light(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int heal;

	heal = dice(1, 8) + level / 3;
	victim->hit = std::min(victim->hit + heal, (int)victim->max_hit);

	update_pos(victim);
	send_to_char("You feel better!\n\r", victim);

	if (ch != victim)
		send_to_char("Ok.\n\r", ch);
}